

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O2

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  bool bVar1;
  long timeT;
  allocator local_71;
  string local_70;
  string local_50;
  
  bVar1 = cmsys::SystemTools::FileExists(path);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_70,path,&local_71);
    timeT = cmsys::SystemTools::ModifiedTime(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_50,(string *)formatString);
    CreateTimestampFromTimeT(__return_storage_ptr__,this,timeT,&local_50,utcFlag);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
  const std::string& formatString, bool utcFlag)
{
  if(!cmsys::SystemTools::FileExists(path))
    {
    return std::string();
    }

  time_t mtime = cmsys::SystemTools::ModifiedTime(path);
  return CreateTimestampFromTimeT(mtime, formatString, utcFlag);
}